

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_param(Net *this,DataReader *dr)

{
  string *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar1;
  undefined8 *puVar2;
  pointer pBVar3;
  int *piVar4;
  Allocator *pAVar5;
  pointer pMVar6;
  long *plVar7;
  Layer *pLVar8;
  DataReader *pDVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  long lVar15;
  void *__ptr;
  Mat *pMVar16;
  long lVar17;
  char *pcVar18;
  int iVar19;
  int j;
  long lVar20;
  size_t sVar21;
  int *piVar22;
  size_t sStack_430;
  allocator<char> local_421;
  int top_count;
  int bottom_count;
  Layer *local_418;
  int local_40c;
  ulong local_408;
  int blob_count;
  Mat *local_3f8;
  ulong local_3f0;
  ulong local_3e8;
  long local_3e0;
  int layer_count;
  DataReader *local_3d0;
  vector<int,_std::allocator<int>_> *local_3c8;
  int magic;
  ParamDict pd;
  Mat local_388;
  char bottom_name [256];
  char layer_type [256];
  char layer_name [256];
  
  magic = 0;
  iVar10 = (*dr->_vptr_DataReader[2])(dr,"%d");
  if (iVar10 == 1) {
    if (magic == 0x7685dd) {
      layer_count = 0;
      blob_count = 0;
      iVar10 = (*dr->_vptr_DataReader[2])(dr,"%d");
      if (iVar10 == 1) {
        iVar10 = (*dr->_vptr_DataReader[2])(dr,"%d",&blob_count);
        if (iVar10 == 1) {
          if ((0 < (long)layer_count) && (0 < blob_count)) {
            local_3d0 = dr;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (&this->d->layers,(long)layer_count);
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize
                      (&this->d->blobs,(long)blob_count);
            ParamDict::ParamDict(&pd);
            uVar13 = 0;
            local_3e8 = 0;
            do {
              pDVar9 = local_3d0;
              if ((long)layer_count <= (long)uVar13) {
                NetPrivate::update_input_output_indexes(this->d);
                iVar10 = 0;
                NetPrivate::update_input_output_names(this->d);
LAB_001844e3:
                ParamDict::~ParamDict(&pd);
                return iVar10;
              }
              bottom_count = 0;
              top_count = 0;
              local_408 = uVar13;
              iVar10 = (*local_3d0->_vptr_DataReader[2])(local_3d0,"%255s",layer_type);
              if (iVar10 != 1) {
                pcVar18 = "parse layer_type failed";
LAB_001845be:
                sStack_430 = 0x17;
LAB_001844cc:
                fwrite(pcVar18,sStack_430,1,_stderr);
                fputc(10,_stderr);
LAB_001844e0:
                iVar10 = -1;
                goto LAB_001844e3;
              }
              iVar10 = (*pDVar9->_vptr_DataReader[2])(pDVar9,"%255s",layer_name);
              if (iVar10 != 1) {
                pcVar18 = "parse layer_name failed";
                goto LAB_001845be;
              }
              iVar10 = (*pDVar9->_vptr_DataReader[2])(pDVar9,"%d",&bottom_count);
              if (iVar10 != 1) {
                pcVar18 = "parse bottom_count failed";
                sStack_430 = 0x19;
                goto LAB_001844cc;
              }
              iVar10 = (*pDVar9->_vptr_DataReader[2])(pDVar9,"%d",&top_count);
              if (iVar10 != 1) {
                pcVar18 = "parse top_count failed";
LAB_001844ca:
                sStack_430 = 0x16;
                goto LAB_001844cc;
              }
              iVar10 = (*this->_vptr_Net[4])(this,layer_type);
              local_418 = (Layer *)CONCAT44(extraout_var,iVar10);
              if ((local_418 == (Layer *)0x0) &&
                 (local_418 = create_layer(layer_type), local_418 == (Layer *)0x0)) {
                iVar10 = (*this->_vptr_Net[3])(this,layer_type);
                local_418 = (Layer *)CONCAT44(extraout_var_00,iVar10);
                if (local_418 != (Layer *)0x0) goto LAB_00183c88;
                fprintf(_stderr,"layer %s not exists or registered",layer_type);
                fputc(10,_stderr);
                clear(this);
                goto LAB_001844e0;
              }
LAB_00183c88:
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)bottom_name,layer_type,(allocator<char> *)&local_388);
              pLVar8 = local_418;
              std::__cxx11::string::operator=((string *)&local_418->type,(string *)bottom_name);
              std::__cxx11::string::~string((string *)bottom_name);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)bottom_name,layer_name,(allocator<char> *)&local_388);
              this_00 = &pLVar8->name;
              std::__cxx11::string::operator=((string *)this_00,(string *)bottom_name);
              std::__cxx11::string::~string((string *)bottom_name);
              this_01 = &pLVar8->bottoms;
              std::vector<int,_std::allocator<int>_>::resize(this_01,(long)bottom_count);
              lVar15 = 0;
              while( true ) {
                uVar13 = local_3e8;
                iVar10 = (int)local_3e8;
                lVar20 = (long)(int)local_3e8;
                if (bottom_count <= lVar15) break;
                iVar11 = (*local_3d0->_vptr_DataReader[2])(local_3d0,"%255s",(Mat *)bottom_name);
                if (iVar11 != 1) {
                  pcVar18 = "parse bottom_name failed";
                  sStack_430 = 0x18;
                  goto LAB_001844cc;
                }
                iVar11 = find_blob_index_by_name(this,bottom_name);
                if (iVar11 == -1) {
                  pBVar3 = (this->d->blobs).
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_388,bottom_name,&local_421);
                  std::__cxx11::string::operator=((string *)(pBVar3 + lVar20),(string *)&local_388);
                  std::__cxx11::string::~string((string *)&local_388);
                  iVar11 = (int)local_3e8;
                  local_3e8 = (ulong)(iVar10 + 1);
                }
                else {
                  lVar20 = (long)iVar11;
                }
                (this->d->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl
                .super__Vector_impl_data._M_start[lVar20].consumer = (int)local_408;
                (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar15] = iVar11;
                lVar15 = lVar15 + 1;
              }
              local_3c8 = &local_418->tops;
              std::vector<int,_std::allocator<int>_>::resize(local_3c8,(long)top_count);
              local_3e8 = uVar13 & 0xffffffff;
              lVar20 = lVar20 * 0x70;
              for (lVar15 = 0; lVar15 < top_count; lVar15 = lVar15 + 1) {
                pBVar3 = (this->d->blobs).
                         super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                         super__Vector_impl_data._M_start;
                iVar10 = (*local_3d0->_vptr_DataReader[2])(local_3d0,"%255s",(Mat *)bottom_name);
                if (iVar10 != 1) {
                  pcVar18 = "parse blob_name failed";
                  goto LAB_001844ca;
                }
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_388,bottom_name,&local_421);
                std::__cxx11::string::operator=
                          ((string *)((long)&(pBVar3->name)._M_dataplus._M_p + lVar20),
                           (string *)&local_388);
                std::__cxx11::string::~string((string *)&local_388);
                *(int *)((long)&pBVar3->producer + lVar20) = (int)local_408;
                (local_3c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar15] = (int)local_3e8 + (int)lVar15;
                lVar20 = lVar20 + 0x70;
              }
              iVar10 = ParamDict::load_param(&pd,local_3d0);
              uVar13 = local_408;
              if (iVar10 == 0) {
                if (local_418->support_int8_storage == true) {
                  (this->opt).use_vulkan_compute = false;
                }
                local_388.cstep = 0;
                local_388.data = (void *)0x0;
                local_388.refcount._0_4_ = 0;
                local_388.refcount._4_4_ = 0;
                local_388.elemsize._0_4_ = 0;
                local_388._20_8_ = 0;
                local_388.h = 0;
                local_388.d = 0;
                local_388.c = 0;
                local_388.allocator = (Allocator *)0x0;
                local_388.dims = 0;
                local_388.w = 0;
                ParamDict::get((Mat *)bottom_name,&pd,0x1e,&local_388);
                piVar22 = (int *)CONCAT44(local_388.refcount._4_4_,local_388.refcount._0_4_);
                if (piVar22 != (int *)0x0) {
                  LOCK();
                  *piVar22 = *piVar22 + -1;
                  UNLOCK();
                  if (*piVar22 == 0) {
                    if (local_388.allocator == (Allocator *)0x0) {
                      free(local_388.data);
                    }
                    else {
                      (*(local_388.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                if ((bottom_name._0_8_ != 0) &&
                   ((long)(int)bottom_name._56_4_ * bottom_name._64_8_ != 0)) {
                  piVar22 = (int *)(bottom_name._0_8_ + 0xc);
                  for (lVar20 = 0; iVar10 = 1, lVar20 < top_count; lVar20 = lVar20 + 1) {
                    iVar11 = (local_3c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start[lVar20];
                    pBVar3 = (this->d->blobs).
                             super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    iVar14 = piVar22[-3];
                    if (iVar14 == 3) {
                      uVar12 = piVar22[-2];
                      uVar13 = (ulong)(int)uVar12;
                      iVar10 = piVar22[-1];
                      lVar17 = (long)iVar10;
                      iVar19 = *piVar22;
                      sVar21 = lVar17 * uVar13 + 3 & 0x3ffffffffffffffc;
                      pMVar16 = &pBVar3[iVar11].shape;
                      piVar4 = pBVar3[iVar11].shape.refcount;
                      if (piVar4 == (int *)0x0) {
LAB_001840de:
                        iVar14 = 3;
                      }
                      else {
                        LOCK();
                        *piVar4 = *piVar4 + -1;
                        UNLOCK();
                        if (*piVar4 != 0) goto LAB_001840de;
                        __ptr = pBVar3[iVar11].shape.data;
                        pAVar5 = pBVar3[iVar11].shape.allocator;
                        local_3f0 = uVar13;
                        local_3e0 = lVar17;
                        if (pAVar5 == (Allocator *)0x0) {
LAB_001840f7:
                          local_40c = iVar19;
                          local_3f8 = &pBVar3[iVar11].shape;
                          free(__ptr);
                          uVar12 = (uint)local_3f0;
                          iVar10 = (int)local_3e0;
                          pMVar16 = local_3f8;
                          iVar19 = local_40c;
                        }
                        else {
                          local_40c = iVar19;
                          local_3f8 = pMVar16;
                          (*pAVar5->_vptr_Allocator[3])();
                          iVar14 = 3;
                          uVar12 = (uint)local_3f0;
                          iVar10 = (int)local_3e0;
                          pMVar16 = local_3f8;
                          iVar19 = local_40c;
                        }
                      }
LAB_00184116:
                      pMVar16->data = (void *)0x0;
                      pMVar16->refcount = (int *)0x0;
                      pBVar3[iVar11].shape.elemsize = 4;
                      pBVar3[iVar11].shape.elempack = 1;
                      pBVar3[iVar11].shape.allocator = (Allocator *)0x0;
                      pBVar3[iVar11].shape.dims = iVar14;
                      pBVar3[iVar11].shape.w = uVar12;
                      pBVar3[iVar11].shape.h = iVar10;
                      pBVar3[iVar11].shape.d = 1;
                      pBVar3[iVar11].shape.c = iVar19;
                      pBVar3[iVar11].shape.cstep = sVar21;
                    }
                    else {
                      if (iVar14 == 2) {
                        uVar12 = piVar22[-2];
                        uVar13 = (ulong)(int)uVar12;
                        iVar19 = piVar22[-1];
                        lVar17 = (long)iVar19;
                        sVar21 = lVar17 * uVar13;
                        piVar4 = pBVar3[iVar11].shape.refcount;
                        if (piVar4 != (int *)0x0) {
                          LOCK();
                          *piVar4 = *piVar4 + -1;
                          UNLOCK();
                          if (*piVar4 == 0) {
                            __ptr = pBVar3[iVar11].shape.data;
                            pAVar5 = pBVar3[iVar11].shape.allocator;
                            iVar19 = iVar10;
                            local_3f0 = uVar13;
                            local_3e0 = lVar17;
                            if (pAVar5 == (Allocator *)0x0) goto LAB_001840f7;
                            local_3f8 = &pBVar3[iVar11].shape;
                            (*pAVar5->_vptr_Allocator[3])();
                            iVar14 = 2;
                            uVar12 = (uint)local_3f0;
                            iVar10 = (int)local_3e0;
                            pMVar16 = local_3f8;
                            iVar19 = 1;
                            goto LAB_00184116;
                          }
                        }
                        iVar10 = iVar19;
                        iVar19 = 2;
LAB_001840e7:
                        iVar14 = iVar19;
                        pMVar16 = &pBVar3[iVar11].shape;
                        iVar19 = 1;
                        goto LAB_00184116;
                      }
                      if (iVar14 == 1) {
                        uVar12 = piVar22[-2];
                        sVar21 = (size_t)(int)uVar12;
                        piVar4 = pBVar3[iVar11].shape.refcount;
                        iVar19 = iVar10;
                        if (piVar4 != (int *)0x0) {
                          LOCK();
                          *piVar4 = *piVar4 + -1;
                          UNLOCK();
                          if (*piVar4 == 0) {
                            __ptr = pBVar3[iVar11].shape.data;
                            pAVar5 = pBVar3[iVar11].shape.allocator;
                            local_3f0 = (ulong)uVar12;
                            if (pAVar5 == (Allocator *)0x0) {
                              local_3e0 = 1;
                              goto LAB_001840f7;
                            }
                            local_3f8 = &pBVar3[iVar11].shape;
                            (*pAVar5->_vptr_Allocator[3])();
                            iVar10 = 1;
                            uVar12 = (uint)local_3f0;
                            pMVar16 = local_3f8;
                            iVar14 = iVar10;
                            iVar19 = iVar10;
                            goto LAB_00184116;
                          }
                        }
                        goto LAB_001840e7;
                      }
                    }
                    piVar22 = piVar22 + 4;
                  }
                }
                pvVar1 = &local_418->bottom_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                          (pvVar1,(long)bottom_count);
                lVar20 = 0;
                for (lVar17 = 0; lVar17 < bottom_count; lVar17 = lVar17 + 1) {
                  iVar10 = (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar17];
                  pBVar3 = (this->d->blobs).
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pMVar6 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  puVar2 = (undefined8 *)((long)&pMVar6->data + lVar20);
                  if ((Mat *)puVar2 != &pBVar3[iVar10].shape) {
                    piVar22 = pBVar3[iVar10].shape.refcount;
                    if (piVar22 != (int *)0x0) {
                      LOCK();
                      *piVar22 = *piVar22 + 1;
                      UNLOCK();
                    }
                    piVar22 = *(int **)((long)&pMVar6->refcount + lVar20);
                    if (piVar22 != (int *)0x0) {
                      LOCK();
                      *piVar22 = *piVar22 + -1;
                      UNLOCK();
                      if (*piVar22 == 0) {
                        plVar7 = *(long **)((long)&pMVar6->allocator + lVar20);
                        if (plVar7 == (long *)0x0) {
                          free(*(void **)((long)&pMVar6->data + lVar20));
                        }
                        else {
                          (**(code **)(*plVar7 + 0x18))();
                        }
                      }
                    }
                    *(undefined8 *)((long)&pMVar6->cstep + lVar20) = 0;
                    *(undefined8 *)((long)puVar2 + 0xc) = 0;
                    *(undefined8 *)((long)puVar2 + 0x14) = 0;
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    *(undefined4 *)((long)&pMVar6->c + lVar20) = 0;
                    puVar2 = (undefined8 *)((long)&pMVar6->dims + lVar20);
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    piVar22 = pBVar3[iVar10].shape.refcount;
                    puVar2 = (undefined8 *)((long)&pMVar6->data + lVar20);
                    *puVar2 = pBVar3[iVar10].shape.data;
                    puVar2[1] = piVar22;
                    *(size_t *)((long)&pMVar6->elemsize + lVar20) = pBVar3[iVar10].shape.elemsize;
                    *(int *)((long)&pMVar6->elempack + lVar20) = pBVar3[iVar10].shape.elempack;
                    *(Allocator **)((long)&pMVar6->allocator + lVar20) =
                         pBVar3[iVar10].shape.allocator;
                    iVar11 = pBVar3[iVar10].shape.w;
                    iVar14 = pBVar3[iVar10].shape.h;
                    iVar19 = pBVar3[iVar10].shape.d;
                    piVar22 = (int *)((long)&pMVar6->dims + lVar20);
                    *piVar22 = pBVar3[iVar10].shape.dims;
                    piVar22[1] = iVar11;
                    piVar22[2] = iVar14;
                    piVar22[3] = iVar19;
                    *(int *)((long)&pMVar6->c + lVar20) = pBVar3[iVar10].shape.c;
                    *(size_t *)((long)&pMVar6->cstep + lVar20) = pBVar3[iVar10].shape.cstep;
                  }
                  lVar20 = lVar20 + 0x48;
                }
                pvVar1 = &local_418->top_shapes;
                std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize(pvVar1,(long)top_count);
                lVar20 = 0;
                for (lVar17 = 0; lVar17 < top_count; lVar17 = lVar17 + 1) {
                  iVar10 = (local_3c8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start[lVar17];
                  pBVar3 = (this->d->blobs).
                           super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pMVar6 = (pvVar1->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_start;
                  puVar2 = (undefined8 *)((long)&pMVar6->data + lVar20);
                  if ((Mat *)puVar2 != &pBVar3[iVar10].shape) {
                    piVar22 = pBVar3[iVar10].shape.refcount;
                    if (piVar22 != (int *)0x0) {
                      LOCK();
                      *piVar22 = *piVar22 + 1;
                      UNLOCK();
                    }
                    piVar22 = *(int **)((long)&pMVar6->refcount + lVar20);
                    if (piVar22 != (int *)0x0) {
                      LOCK();
                      *piVar22 = *piVar22 + -1;
                      UNLOCK();
                      if (*piVar22 == 0) {
                        plVar7 = *(long **)((long)&pMVar6->allocator + lVar20);
                        if (plVar7 == (long *)0x0) {
                          free(*(void **)((long)&pMVar6->data + lVar20));
                        }
                        else {
                          (**(code **)(*plVar7 + 0x18))();
                        }
                      }
                    }
                    *(undefined8 *)((long)&pMVar6->cstep + lVar20) = 0;
                    *(undefined8 *)((long)puVar2 + 0xc) = 0;
                    *(undefined8 *)((long)puVar2 + 0x14) = 0;
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    *(undefined4 *)((long)&pMVar6->c + lVar20) = 0;
                    puVar2 = (undefined8 *)((long)&pMVar6->dims + lVar20);
                    *puVar2 = 0;
                    puVar2[1] = 0;
                    piVar22 = pBVar3[iVar10].shape.refcount;
                    puVar2 = (undefined8 *)((long)&pMVar6->data + lVar20);
                    *puVar2 = pBVar3[iVar10].shape.data;
                    puVar2[1] = piVar22;
                    *(size_t *)((long)&pMVar6->elemsize + lVar20) = pBVar3[iVar10].shape.elemsize;
                    *(int *)((long)&pMVar6->elempack + lVar20) = pBVar3[iVar10].shape.elempack;
                    *(Allocator **)((long)&pMVar6->allocator + lVar20) =
                         pBVar3[iVar10].shape.allocator;
                    iVar11 = pBVar3[iVar10].shape.w;
                    iVar14 = pBVar3[iVar10].shape.h;
                    iVar19 = pBVar3[iVar10].shape.d;
                    piVar22 = (int *)((long)&pMVar6->dims + lVar20);
                    *piVar22 = pBVar3[iVar10].shape.dims;
                    piVar22[1] = iVar11;
                    piVar22[2] = iVar14;
                    piVar22[3] = iVar19;
                    *(int *)((long)&pMVar6->c + lVar20) = pBVar3[iVar10].shape.c;
                    *(size_t *)((long)&pMVar6->cstep + lVar20) = pBVar3[iVar10].shape.cstep;
                  }
                  lVar20 = lVar20 + 0x48;
                }
                iVar10 = ParamDict::get(&pd,0x1f,0);
                local_418->featmask = iVar10;
                iVar10 = (*local_418->_vptr_Layer[2])(local_418,&pd);
                if (iVar10 == 0) {
                  (this->d->layers).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start[local_408] = local_418;
                  iVar10 = 0;
                }
                else {
                  fprintf(_stderr,"layer load_param %d %s failed",local_408,
                          (this_00->_M_dataplus)._M_p);
                  fputc(10,_stderr);
                  iVar10 = 0xe;
                }
                if (bottom_name._8_8_ != 0) {
                  LOCK();
                  *(int *)bottom_name._8_8_ = *(int *)bottom_name._8_8_ + -1;
                  UNLOCK();
                  if (*(int *)bottom_name._8_8_ == 0) {
                    if (bottom_name._32_8_ == 0) {
                      free((void *)bottom_name._0_8_);
                    }
                    else {
                      (**(code **)(*(long *)bottom_name._32_8_ + 0x18))();
                    }
                  }
                }
                uVar13 = local_408;
                if ((iVar10 != 0xe) && (iVar10 != 0)) goto LAB_001844e0;
              }
              else {
                fprintf(_stderr,"ParamDict load_param %d %s failed",local_408 & 0xffffffff,
                        (this_00->_M_dataplus)._M_p);
                fputc(10,_stderr);
              }
              local_3e8 = local_3e8 + lVar15;
              uVar13 = uVar13 + 1;
            } while( true );
          }
          pcVar18 = "invalid layer_count or blob_count";
          sStack_430 = 0x21;
        }
        else {
          pcVar18 = "parse blob_count failed";
          sStack_430 = 0x17;
        }
      }
      else {
        pcVar18 = "parse layer_count failed";
        sStack_430 = 0x18;
      }
    }
    else {
      pcVar18 = "param is too old, please regenerate";
      sStack_430 = 0x23;
    }
  }
  else {
    pcVar18 = "parse magic failed";
    sStack_430 = 0x12;
  }
  fwrite(pcVar18,sStack_430,1,_stderr);
  fputc(10,_stderr);
  return -1;
}

Assistant:

int Net::load_param(const DataReader& dr)
{
#define SCAN_VALUE(fmt, v)                \
    if (dr.scan(fmt, &v) != 1)            \
    {                                     \
        NCNN_LOGE("parse " #v " failed"); \
        return -1;                        \
    }

    int magic = 0;
    SCAN_VALUE("%d", magic)
    if (magic != 7767517)
    {
        NCNN_LOGE("param is too old, please regenerate");
        return -1;
    }

    // parse
    int layer_count = 0;
    int blob_count = 0;
    SCAN_VALUE("%d", layer_count)
    SCAN_VALUE("%d", blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        NCNN_LOGE("invalid layer_count or blob_count");
        return -1;
    }

    d->layers.resize((size_t)layer_count);
    d->blobs.resize((size_t)blob_count);

#if NCNN_VULKAN
    // TODO enable gpu when bf16 conversion implemented
    if (opt.use_bf16_storage)
        opt.use_vulkan_compute = false;

    if (opt.use_vulkan_compute)
    {
        if (!d->vkdev) d->vkdev = get_gpu_device();
        if (!d->vkdev) opt.use_vulkan_compute = false; // no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!d->vkdev->info.support_fp16_packed()) opt.use_fp16_packed = false;
        if (!d->vkdev->info.support_fp16_storage()) opt.use_fp16_storage = false;
        if (!d->vkdev->info.support_fp16_arithmetic()) opt.use_fp16_arithmetic = false;
        if (!d->vkdev->info.support_int8_storage()) opt.use_int8_storage = false;
        if (!d->vkdev->info.support_int8_arithmetic()) opt.use_int8_arithmetic = false;
        if (!d->vkdev->info.support_cooperative_matrix()) opt.use_cooperative_matrix = false;

        if (d->vkdev->info.bug_buffer_image_load_zero()) opt.use_image_storage = false;

        // enable local memory optimization on discrete gpu only
        if (d->vkdev->info.type() != 0) opt.use_shader_local_memory = false;

        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_packed && !opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
    else
    {
        // fp16a makes no sense when fp16 storage disabled
        if (!opt.use_fp16_storage) opt.use_fp16_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    int blob_index = 0;
    for (int i = 0; i < layer_count; i++)
    {
        char layer_type[256];
        char layer_name[256];
        int bottom_count = 0;
        int top_count = 0;
        SCAN_VALUE("%255s", layer_type)
        SCAN_VALUE("%255s", layer_name)
        SCAN_VALUE("%d", bottom_count)
        SCAN_VALUE("%d", top_count)

        Layer* layer = create_overwrite_builtin_layer(layer_type);
        if (!layer)
        {
            layer = create_layer(layer_type);
        }
        if (!layer)
        {
            layer = create_custom_layer(layer_type);
        }
        if (!layer)
        {
            NCNN_LOGE("layer %s not exists or registered", layer_type);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = d->vkdev;
#endif // NCNN_VULKAN

        layer->type = std::string(layer_type);
        layer->name = std::string(layer_name);
        //         NCNN_LOGE("new layer %d %s", i, layer_name);

        layer->bottoms.resize(bottom_count);

        for (int j = 0; j < bottom_count; j++)
        {
            char bottom_name[256];
            SCAN_VALUE("%255s", bottom_name)

            int bottom_blob_index = find_blob_index_by_name(bottom_name);
            if (bottom_blob_index == -1)
            {
                Blob& blob = d->blobs[blob_index];

                bottom_blob_index = blob_index;

                blob.name = std::string(bottom_name);
                //                 NCNN_LOGE("new blob %s", bottom_name);

                blob_index++;
            }

            Blob& blob = d->blobs[bottom_blob_index];

            blob.consumer = i;

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            Blob& blob = d->blobs[blob_index];

            char blob_name[256];
            SCAN_VALUE("%255s", blob_name)

            blob.name = std::string(blob_name);
            //             NCNN_LOGE("new blob %s", blob_name);

            blob.producer = i;

            layer->tops[j] = blob_index;

            blob_index++;
        }

        // layer specific params
        int pdlr = pd.load_param(dr);
        if (pdlr != 0)
        {
            NCNN_LOGE("ParamDict load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        if (layer->support_int8_storage)
        {
            // no int8 gpu support yet
            opt.use_vulkan_compute = false;
        }

        // pull out top shape hints
        Mat shape_hints = pd.get(30, Mat());
        if (!shape_hints.empty())
        {
            const int* psh = shape_hints;
            for (int j = 0; j < top_count; j++)
            {
                Blob& blob = d->blobs[layer->tops[j]];

                int dims = psh[0];
                if (dims == 1)
                {
                    blob.shape = Mat(psh[1], (void*)0, 4u, 1);
                }
                if (dims == 2)
                {
                    blob.shape = Mat(psh[1], psh[2], (void*)0, 4u, 1);
                }
                if (dims == 3)
                {
                    blob.shape = Mat(psh[1], psh[2], psh[3], (void*)0, 4u, 1);
                }

                psh += 4;
            }
        }

        // set bottom and top shape hints
        layer->bottom_shapes.resize(bottom_count);
        for (int j = 0; j < bottom_count; j++)
        {
            layer->bottom_shapes[j] = d->blobs[layer->bottoms[j]].shape;
        }

        layer->top_shapes.resize(top_count);
        for (int j = 0; j < top_count; j++)
        {
            layer->top_shapes[j] = d->blobs[layer->tops[j]].shape;
        }

        // pull out layer specific feature disabled set
        layer->featmask = pd.get(31, 0);

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            NCNN_LOGE("layer load_param %d %s failed", i, layer->name.c_str());
            continue;
        }

        d->layers[i] = layer;
    }

    d->update_input_output_indexes();
    d->update_input_output_names();

#undef SCAN_VALUE
    return 0;
}